

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fairness_test.cpp
# Opt level: O0

void __thiscall
FairMutexTest_FifoSched_Test<yamc::fair::timed_mutex>::TestBody
          (FairMutexTest_FifoSched_Test<yamc::fair::timed_mutex> *this)

{
  anon_class_24_3_d9b03587_for_f f;
  bool bVar1;
  char *message;
  AssertHelper local_178;
  Message local_170;
  duration<long,_std::ratio<1L,_1000000L>_> local_168;
  int local_160 [2];
  duration<long,_std::ratio<1L,_1000L>_> local_158;
  duration<long,_std::ratio<1L,_1000L>_> local_150;
  undefined1 local_148 [8];
  AssertionResult gtest_ar;
  stopwatch<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>
  local_120;
  stopwatch<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>
  sw;
  timed_mutex local_108 [8];
  TypeParam mtx;
  undefined1 local_90 [8];
  phaser phaser;
  atomic<int> step;
  FairMutexTest_FifoSched_Test<yamc::fair::timed_mutex> *this_local;
  
  phaser.mtx_.super___mutex_base._M_mutex._36_4_ = 0;
  yamc::test::phaser::phaser((phaser *)local_90,3);
  yamc::fair::timed_mutex::timed_mutex(local_108);
  yamc::test::
  stopwatch<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>
  ::stopwatch(&local_120);
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )local_90;
  f.mtx = (TypeParam *)local_108;
  f.phaser = (phaser *)
             gtest_ar.message_._M_t.
             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl;
  f.step = (atomic<int> *)((long)&phaser.mtx_.super___mutex_base._M_mutex + 0x24);
  yamc::test::
  task_runner<FairMutexTest_FifoSched_Test<yamc::fair::timed_mutex>::TestBody()::_lambda(unsigned_long)_1_>
            (3,f);
  local_160[1] = 200;
  std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
            ((duration<long,std::ratio<1l,1000l>> *)&local_158,local_160 + 1);
  local_160[0] = 7;
  local_150 = std::chrono::operator*(&local_158,local_160);
  local_168 = yamc::test::
              stopwatch<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000L>_>_>
              ::elapsed(&local_120);
  testing::internal::
  CmpHelperLE<std::chrono::duration<long,std::ratio<1l,1000l>>,std::chrono::duration<long,std::ratio<1l,1000000l>>>
            ((internal *)local_148,"std::chrono::milliseconds(200) * 7","sw.elapsed()",&local_150,
             &local_168);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_148);
  if (!bVar1) {
    testing::Message::Message(&local_170);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_148);
    testing::internal::AssertHelper::AssertHelper
              (&local_178,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/yohhoy[P]yamc/tests/fairness_test.cpp"
               ,0x57,message);
    testing::internal::AssertHelper::operator=(&local_178,&local_170);
    testing::internal::AssertHelper::~AssertHelper(&local_178);
    testing::Message::~Message(&local_170);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_148);
  yamc::fair::timed_mutex::~timed_mutex(local_108);
  yamc::test::phaser::~phaser((phaser *)local_90);
  return;
}

Assistant:

TYPED_TEST(FairMutexTest, FifoSched)
{
  SETUP_STEPTEST;
  yamc::test::phaser phaser(3);
  TypeParam mtx;
  yamc::test::stopwatch<> sw;
  yamc::test::task_runner(3, [&](std::size_t id) {
    auto ph = phaser.get(id);
    switch (id) {
    case 0:
      EXPECT_TRUE(mtx.try_lock());
      EXPECT_STEP(1);
      ph.advance(2);  // p1-2
      ph.await();     // p3
      EXPECT_STEP(4);
      mtx.unlock();
      mtx.lock();
      EXPECT_STEP(7);
      mtx.unlock();
      break;
    case 1:
      ph.await();     // p1
      EXPECT_STEP(2);
      ph.advance(2);  // p2-3
      mtx.lock();
      EXPECT_STEP(5);
      mtx.unlock();
      break;
    case 2:
      ph.await();     // p1
      EXPECT_FALSE(mtx.try_lock());
      ph.await();     // p2
      EXPECT_STEP(3);
      ph.advance(1);  // p3
      mtx.lock();
      EXPECT_STEP(6);
      mtx.unlock();
      break;
    }
  });
  EXPECT_LE(TEST_TICKS * 7, sw.elapsed());
}